

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuVfsShmLock(sqlite3_file *pFile,int ofst,int n,int flags)

{
  uint *puVar1;
  sqlite3_io_methods *psVar2;
  byte bVar3;
  int iVar4;
  
  psVar2 = pFile[3].pMethods;
  if ((psVar2 == (sqlite3_io_methods *)0x0) || (1 < psVar2->iVersion - 1U)) {
    if ((n == 1) &&
       (((flags & 8U) != 0 && psVar2 != (sqlite3_io_methods *)0x0 && (psVar2->iVersion == 3)))) {
      bVar3 = 0;
      if ((((uint)ofst < 4) && (bVar3 = 0, ofst != 2)) && (bVar3 = 1, (flags & 1U) != 0)) {
        return 0;
      }
    }
    else {
      bVar3 = 0;
    }
    iVar4 = (**(code **)(*(long *)pFile[1].pMethods + 0x70))(pFile[1].pMethods,ofst);
    if ((bool)(iVar4 == 0 & bVar3)) {
      bVar3 = (byte)ofst & 0x1f;
      puVar1 = (uint *)((long)&psVar2[1].xFetch + 4);
      *puVar1 = *puVar1 | 1 << bVar3;
      iVar4 = 0 << bVar3;
    }
  }
  else {
    iVar4 = (uint)(n == 1 && ofst == 1) * 5;
  }
  return iVar4;
}

Assistant:

static int rbuVfsShmLock(sqlite3_file *pFile, int ofst, int n, int flags){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc = SQLITE_OK;

#ifdef SQLITE_AMALGAMATION
    assert( WAL_CKPT_LOCK==1 );
#endif

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( pRbu && (pRbu->eStage==RBU_STAGE_OAL || pRbu->eStage==RBU_STAGE_MOVE) ){
    /* Magic number 1 is the WAL_CKPT_LOCK lock. Preventing SQLite from
    ** taking this lock also prevents any checkpoints from occurring. 
    ** todo: really, it's not clear why this might occur, as 
    ** wal_autocheckpoint ought to be turned off.  */
    if( ofst==WAL_LOCK_CKPT && n==1 ) rc = SQLITE_BUSY;
  }else{
    int bCapture = 0;
    if( n==1 && (flags & SQLITE_SHM_EXCLUSIVE)
     && pRbu && pRbu->eStage==RBU_STAGE_CAPTURE
     && (ofst==WAL_LOCK_WRITE || ofst==WAL_LOCK_CKPT || ofst==WAL_LOCK_READ0)
    ){
      bCapture = 1;
    }

    if( bCapture==0 || 0==(flags & SQLITE_SHM_UNLOCK) ){
      rc = p->pReal->pMethods->xShmLock(p->pReal, ofst, n, flags);
      if( bCapture && rc==SQLITE_OK ){
        pRbu->mLock |= (1 << ofst);
      }
    }
  }

  return rc;
}